

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  runtime_error *this;
  float fVar3;
  ProgramOptions po;
  char *end;
  allocator local_b1;
  undefined1 local_b0 [40];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  bool local_68;
  undefined8 local_64;
  float local_5c;
  bool local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_b0._0_8_ = local_b0 + 0x10;
  local_b0._8_8_ = 0;
  local_b0[0x10] = '\0';
  local_b0[0x20] = false;
  local_b0[0x21] = false;
  local_88._M_p = (pointer)&local_78;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68 = false;
  local_64._0_4_ = 0xb;
  local_64._4_1_ = false;
  local_64._5_1_ = false;
  local_64._6_1_ = false;
  local_64._7_1_ = false;
  local_5c = 2.674;
  local_58 = false;
  if (argc == 1) {
    ProgramOptions::usage(argv);
  }
  do {
    iVar1 = getopt(argc,argv,"hg:menfir:ac");
    switch(iVar1) {
    case 0x61:
      local_68 = true;
      local_64._4_2_ = 0x101;
      local_64._7_1_ = true;
      local_b0[0x20] = true;
      local_b0[0x21] = true;
      break;
    case 0x62:
    case 100:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6f:
    case 0x70:
    case 0x71:
      goto switchD_00113761_caseD_62;
    case 99:
      local_b0[0x20] = true;
      break;
    case 0x65:
      local_64._4_2_ = 0x101;
      break;
    case 0x66:
      local_68 = true;
      local_64._4_2_ = 0x101;
      local_64._7_1_ = true;
      break;
    case 0x67:
      lVar2 = strtol(_optarg,local_50,10);
      local_64._0_4_ = (int)lVar2;
      local_68 = true;
      break;
    case 0x69:
      local_58 = true;
      break;
    case 0x6d:
      local_64._4_1_ = true;
      break;
    case 0x6e:
      local_64._6_1_ = true;
      break;
    case 0x72:
      fVar3 = strtof(_optarg,local_50);
      local_5c = (float)((long)fVar3 & 0xffffffff);
      local_64._7_1_ = true;
      break;
    default:
      if (iVar1 != 0x3f) {
        if (iVar1 == -1) {
          if (*argv[(long)argc + -1] == '-') {
            ProgramOptions::usage(argv);
          }
          else {
            std::__cxx11::string::string((string *)local_50,argv[(long)argc + -1],&local_b1);
            std::__cxx11::string::operator=((string *)local_b0,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            std::__cxx11::string::find_last_of(local_b0,0x116690,0xffffffffffffffff);
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_b0);
            std::__cxx11::string::operator=((string *)&local_88,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            std::__cxx11::string::rfind((char)(string *)&local_88,0x2e);
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_88);
            std::__cxx11::string::operator=((string *)&local_88,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
          }
          iVar1 = system("mkdir -p output");
          if (iVar1 != 0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Could not create output directory.");
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          ProgramOptions::run((ProgramOptions *)local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_p != &local_78) {
            operator_delete(local_88._M_p);
          }
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_);
          }
          return 0;
        }
        goto switchD_00113761_caseD_62;
      }
      if ((_optopt == 0x72) || (_optopt == 0x67)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Options -g and -r require an argument.",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
switchD_00113761_caseD_62:
        ProgramOptions::usage(argv);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

  ProgramOptions po;

  if (argc == 1) {
    ProgramOptions::usage(argv);
  }

  // Use GNU getopt to parse command line options
  int opt;
  while ((opt = getopt(argc, argv, "hg:menfir:ac")) != -1) {
    switch (opt) {

      case 'h': {
        ProgramOptions::usage(argv);
        break;
      }

      case 'c': {
        po.cuda = true;
        break;
      }

      case 'g': {
        char *end;
        po.water_opts.blur_size = (unsigned int) std::strtol(optarg, &end, 10);
        po.water_opts.blur = true;
        break;
      }

      case 'm':po.water_opts.histogram = true;
        break;

      case 'e': {
        po.water_opts.enhance = true;
        po.water_opts.histogram = true;
        break;
      }

      case 'n':po.water_opts.enhance_hist = true;
        break;

      case 'f': {
        po.water_opts.blur = true;
        po.water_opts.histogram = true;
        po.water_opts.enhance = true;
        po.water_opts.ripple = true;
        break;
      }

      case 'i':po.water_opts.save_intermediate = true;
        break;

      case 'r': {
        char *end;
        po.water_opts.ripple_frequency = (unsigned int) std::strtof(optarg, &end);
        po.water_opts.ripple = true;
        break;
      }

      case 'a': {
        po.water_opts.blur = true;
        po.water_opts.histogram = true;
        po.water_opts.enhance = true;
        po.water_opts.ripple = true;
        po.test = true;
        po.cuda = true;
        break;
      }

      case '?':
        if ((optopt == 'g') || (optopt == 'r')) {
          std::cerr << "Options -g and -r require an argument." << std::endl;
          ProgramOptions::usage(argv);
        }
        break;

      default:ProgramOptions::usage(argv);
        break;
    }
  }

  // Check if last argument is a filename.
  if (argv[argc - 1][0] != '-') {
    // File name is last argument.
    po.input_file = std::string(argv[argc - 1]);
    // Strip any path
    po.water_opts.img_name = po.input_file.substr(po.input_file.find_last_of("\\/") + 1);
    // Strip the extension
    po.water_opts.img_name = po.water_opts.img_name.substr(0, po.water_opts.img_name.find_last_of('.'));
  } else {
    ProgramOptions::usage(argv);
  }

  // Create an output directory, if it doesn't already exist.
  // This only works for cool operating systems.
  if (system("mkdir -p output") != 0) {
    throw std::runtime_error("Could not create output directory.");
  }

  // Run everything
  po.run();

  return 0;
}